

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluContextInfo.cpp
# Opt level: O0

set<int,_std::less<int>,_std::allocator<int>_> * __thiscall
glu::GetCompressedTextureFormats::operator()
          (set<int,_std::less<int>,_std::allocator<int>_> *__return_storage_ptr__,
          GetCompressedTextureFormats *this,RenderContext *context)

{
  code *pcVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  size_type __n;
  reference pvVar4;
  iterator __first;
  iterator __last;
  iterator __i;
  insert_iterator<std::set<int,_std::less<int>,_std::allocator<int>_>_> __result;
  allocator<int> local_49;
  undefined1 local_48 [8];
  vector<int,_std::allocator<int>_> formats;
  int numFormats;
  Functions *gl;
  RenderContext *context_local;
  GetCompressedTextureFormats *this_local;
  set<int,_std::less<int>,_std::allocator<int>_> *formatSet;
  long lVar3;
  
  iVar2 = (*context->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  formats.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  (**(code **)(lVar3 + 0x868))
            (0x86a2,(undefined1 *)
                    ((long)&formats.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 4));
  __n = (size_type)
        formats.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_;
  std::allocator<int>::allocator(&local_49);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_48,__n,&local_49);
  std::allocator<int>::~allocator(&local_49);
  if (0 < formats.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_) {
    pcVar1 = *(code **)(lVar3 + 0x868);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_48,0);
    (*pcVar1)(0x86a3,pvVar4);
  }
  err = (**(code **)(lVar3 + 0x800))();
  checkError(err,"glGetIntegerv(GL_COMPRESSED_TEXTURE_FORMATS) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluContextInfo.cpp"
             ,0xaf);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(__return_storage_ptr__);
  __first = std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_48);
  __last = std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)local_48);
  __i = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(__return_storage_ptr__);
  __result = std::inserter<std::set<int,std::less<int>,std::allocator<int>>>
                       (__return_storage_ptr__,__i);
  std::
  copy<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::insert_iterator<std::set<int,std::less<int>,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             __result);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

set<int> GetCompressedTextureFormats::operator() (const RenderContext& context) const
{
	const glw::Functions& gl = context.getFunctions();

	int numFormats = 0;
	gl.getIntegerv(GL_NUM_COMPRESSED_TEXTURE_FORMATS, &numFormats);

	vector<int> formats(numFormats);
	if (numFormats > 0)
		gl.getIntegerv(GL_COMPRESSED_TEXTURE_FORMATS, &formats[0]);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv(GL_COMPRESSED_TEXTURE_FORMATS) failed");

	set<int> formatSet;
	std::copy(formats.begin(), formats.end(), std::inserter(formatSet, formatSet.begin()));

	return formatSet;
}